

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

bool bssl::string_util::Base64Encode(string_view *input,string *output)

{
  int iVar1;
  size_type sVar2;
  uchar *t;
  uchar *f;
  undefined4 extraout_var;
  char *pcVar3;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> encoded;
  size_t len;
  string *output_local;
  string_view *input_local;
  
  sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::size(input);
  iVar1 = EVP_EncodedLength((size_t *)
                            &encoded.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10,sVar2);
  if (iVar1 == 0) {
    input_local._7_1_ = false;
  }
  else {
    ::std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_40,
               encoded.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,&local_41);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    t = (uchar *)std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)local_40);
    f = (uchar *)::std::basic_string_view<char,_std::char_traits<char>_>::data(input);
    sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::size(input);
    iVar1 = EVP_EncodeBlock(t,f,(int)sVar2);
    encoded.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         CONCAT44(extraout_var,iVar1);
    input_local._7_1_ = encoded.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ != 0;
    if (input_local._7_1_) {
      pcVar3 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_40);
      ::std::__cxx11::string::assign((char *)output,(ulong)pcVar3);
    }
    ::std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_40);
  }
  return input_local._7_1_;
}

Assistant:

bool Base64Encode(const std::string_view &input, std::string *output) {
  size_t len;
  if (!EVP_EncodedLength(&len, input.size())) {
    return false;
  }
  std::vector<char> encoded(len);
  len = EVP_EncodeBlock(reinterpret_cast<uint8_t *>(encoded.data()),
                        reinterpret_cast<const uint8_t *>(input.data()),
                        input.size());
  if (!len) {
    return false;
  }
  output->assign(encoded.data(), len);
  return true;
}